

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Extract<duckdb::hugeint_t,double>
          (Interpolator<false> *this,hugeint_t *dest,Vector *result)

{
  duckdb *pdVar1;
  uint64_t uVar2;
  bool bVar3;
  InvalidInputException *pIVar4;
  int64_t iVar5;
  double dVar6;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  double result_1;
  double local_58;
  string local_50;
  double local_30;
  
  pdVar1 = (duckdb *)dest->lower;
  uVar2 = dest->upper;
  if (this->CRN == this->FRN) {
    iVar5 = 0;
    bVar3 = TryCast::Operation<duckdb::hugeint_t,double>(*dest,&local_58,false);
    if (!bVar3) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.upper = iVar5;
      input.lower = uVar2;
      CastExceptionText<duckdb::hugeint_t,double>(&local_50,pdVar1,input);
      InvalidInputException::InvalidInputException(pIVar4,&local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar5 = 0;
    bVar3 = TryCast::Operation<duckdb::hugeint_t,double>(*dest,&local_58,false);
    if (!bVar3) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.upper = iVar5;
      input_00.lower = uVar2;
      CastExceptionText<duckdb::hugeint_t,double>(&local_50,pdVar1,input_00);
      InvalidInputException::InvalidInputException(pIVar4,&local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_30 = local_58;
    pdVar1 = (duckdb *)dest[1].lower;
    uVar2 = dest[1].upper;
    iVar5 = 0;
    bVar3 = TryCast::Operation<duckdb::hugeint_t,double>(dest[1],&local_58,false);
    if (!bVar3) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = iVar5;
      input_01.lower = uVar2;
      CastExceptionText<duckdb::hugeint_t,double>(&local_50,pdVar1,input_01);
      InvalidInputException::InvalidInputException(pIVar4,&local_50);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar6 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_58 = dVar6 * local_58 + local_30 * (1.0 - dVar6);
  }
  return local_58;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}